

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O0

uint __thiscall duckdb::Value::GetValueInternal<unsigned_int>(Value *this)

{
  hugeint_t input;
  uhugeint_t input_00;
  string_t input_01;
  interval_t input_02;
  bool bVar1;
  LogicalTypeId LVar2;
  PhysicalType PVar3;
  undefined8 uVar4;
  dtime_tz_t in_RDI;
  LogicalType *in_stack_00000428;
  string *in_stack_fffffffffffffe18;
  Value *in_stack_fffffffffffffe20;
  allocator *paVar5;
  char *in_stack_fffffffffffffe28;
  string_t *in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe3c;
  LogicalTypeId id;
  double in_stack_fffffffffffffe50;
  float input_03;
  undefined7 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe80;
  Value *in_stack_fffffffffffffe88;
  NotImplementedException *in_stack_fffffffffffffe90;
  string local_168 [38];
  undefined1 local_142;
  allocator local_141;
  string local_140 [32];
  LogicalType local_120 [3];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined4 local_6c;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined1 local_45;
  allocator local_31;
  string local_30 [24];
  Value *in_stack_ffffffffffffffe8;
  uint local_4;
  unsigned_short input_04;
  
  id = (LogicalTypeId)((uint)in_stack_fffffffffffffe3c >> 0x18);
  bVar1 = IsNull((Value *)in_RDI.bits);
  if (bVar1) {
    local_45 = 1;
    uVar4 = __cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_30,"Calling GetValueInternal on a value that is NULL",&local_31);
    InternalException::InternalException
              ((InternalException *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    local_45 = 0;
    __cxa_throw(uVar4,&InternalException::typeinfo,InternalException::~InternalException);
  }
  LVar2 = LogicalType::id((LogicalType *)in_RDI.bits);
  bVar1 = SUB81((ulong)in_stack_fffffffffffffe50 >> 0x38,0);
  input_04 = (unsigned_short)((ulong)in_stack_fffffffffffffe50 >> 0x30);
  input_03 = (float)((ulong)in_stack_fffffffffffffe50 >> 0x20);
  switch(LVar2) {
  case BOOLEAN:
    local_4 = Cast::Operation<bool,_unsigned_int>(bVar1);
    break;
  case TINYINT:
    local_4 = Cast::Operation<signed_char,_unsigned_int>(bVar1);
    break;
  case SMALLINT:
    local_4 = Cast::Operation<short,_unsigned_int>(input_04);
    break;
  case INTEGER:
    local_4 = Cast::Operation<int,_unsigned_int>((int)input_03);
    break;
  case BIGINT:
    local_4 = Cast::Operation<long,_unsigned_int>((long)in_stack_fffffffffffffe50);
    break;
  case DATE:
    local_6c = *(undefined4 *)(in_RDI.bits + 0x20);
    local_4 = Cast::Operation<duckdb::date_t,_unsigned_int>((date_t)(int32_t)(in_RDI.bits >> 0x20));
    break;
  case TIME:
    local_78 = *(undefined8 *)(in_RDI.bits + 0x20);
    local_4 = Cast::Operation<duckdb::dtime_t,_unsigned_int>((dtime_t)in_RDI.bits);
    break;
  case TIMESTAMP_SEC:
    local_90 = *(undefined8 *)(in_RDI.bits + 0x20);
    local_4 = Cast::Operation<duckdb::timestamp_sec_t,_unsigned_int>((timestamp_sec_t)in_RDI.bits);
    break;
  case TIMESTAMP_MS:
    local_98 = *(undefined8 *)(in_RDI.bits + 0x20);
    local_4 = Cast::Operation<duckdb::timestamp_ms_t,_unsigned_int>((timestamp_ms_t)in_RDI.bits);
    break;
  case TIMESTAMP:
    local_88 = *(undefined8 *)(in_RDI.bits + 0x20);
    local_4 = Cast::Operation<duckdb::timestamp_t,_unsigned_int>((timestamp_t)in_RDI.bits);
    break;
  case TIMESTAMP_NS:
    local_a0 = *(undefined8 *)(in_RDI.bits + 0x20);
    local_4 = Cast::Operation<duckdb::timestamp_ns_t,_unsigned_int>((timestamp_ns_t)in_RDI.bits);
    break;
  case DECIMAL:
    LogicalType::LogicalType(local_120,id);
    DefaultCastAs(in_stack_fffffffffffffe88,(LogicalType *)in_stack_fffffffffffffe80,
                  (bool)in_stack_fffffffffffffe7f);
    local_4 = GetValueInternal<unsigned_int>(in_stack_ffffffffffffffe8);
    ~Value(in_stack_fffffffffffffe20);
    LogicalType::~LogicalType((LogicalType *)0x2c70b0d);
    break;
  case FLOAT:
    local_4 = Cast::Operation<float,_unsigned_int>(input_03);
    break;
  case DOUBLE:
    local_4 = Cast::Operation<double,_unsigned_int>(in_stack_fffffffffffffe50);
    break;
  default:
    uVar4 = __cxa_allocate_exception(0x10);
    paVar5 = (allocator *)&stack0xfffffffffffffe97;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_168,"Unimplemented type \"%s\" for GetValue()",paVar5);
    LogicalType::ToString(in_stack_00000428);
    NotImplementedException::
    NotImplementedException<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              (in_stack_fffffffffffffe90,(string *)in_stack_fffffffffffffe88,
               in_stack_fffffffffffffe80);
    __cxa_throw(uVar4,&NotImplementedException::typeinfo,
                NotImplementedException::~NotImplementedException);
  case VARCHAR:
    StringValue::Get((Value *)in_RDI.bits);
    ::std::__cxx11::string::c_str();
    string_t::string_t(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    input_01.value.pointer.prefix[3] = in_stack_fffffffffffffe7f;
    input_01.value._0_7_ = in_stack_fffffffffffffe78;
    input_01.value.pointer.ptr = (char *)in_stack_fffffffffffffe80;
    local_4 = Cast::Operation<duckdb::string_t,_unsigned_int>(input_01);
    break;
  case INTERVAL:
    local_c8 = *(undefined8 *)(in_RDI.bits + 0x20);
    local_c0 = *(undefined8 *)(in_RDI.bits + 0x28);
    input_02.days._3_1_ = in_stack_fffffffffffffe7f;
    input_02._0_7_ = in_stack_fffffffffffffe78;
    input_02.micros = (int64_t)in_stack_fffffffffffffe80;
    local_4 = Cast::Operation<duckdb::interval_t,_unsigned_int>(input_02);
    break;
  case UTINYINT:
    local_4 = Cast::Operation<unsigned_char,_unsigned_int>(bVar1);
    break;
  case USMALLINT:
    local_4 = Cast::Operation<unsigned_short,_unsigned_int>(input_04);
    break;
  case UINTEGER:
    local_4 = Cast::Operation<unsigned_int,_unsigned_int>((uint)input_03);
    break;
  case UBIGINT:
    local_4 = Cast::Operation<unsigned_long,_unsigned_int>((unsigned_long)in_stack_fffffffffffffe50)
    ;
    break;
  case TIMESTAMP_TZ:
    local_a8 = *(undefined8 *)(in_RDI.bits + 0x20);
    local_4 = Cast::Operation<duckdb::timestamp_tz_t,_unsigned_int>((timestamp_tz_t)in_RDI.bits);
    break;
  case TIME_TZ:
    local_80 = *(undefined8 *)(in_RDI.bits + 0x20);
    local_4 = Cast::Operation<duckdb::dtime_tz_t,_unsigned_int>(in_RDI);
    break;
  case UHUGEINT:
    local_68 = *(undefined8 *)(in_RDI.bits + 0x20);
    local_60 = *(undefined8 *)(in_RDI.bits + 0x28);
    input_00.lower._7_1_ = in_stack_fffffffffffffe7f;
    input_00.lower._0_7_ = in_stack_fffffffffffffe78;
    input_00.upper = (uint64_t)in_stack_fffffffffffffe80;
    local_4 = Cast::Operation<duckdb::uhugeint_t,_unsigned_int>(input_00);
    break;
  case HUGEINT:
  case UUID:
    local_58 = *(undefined8 *)(in_RDI.bits + 0x20);
    local_50 = *(undefined8 *)(in_RDI.bits + 0x28);
    input.lower._7_1_ = in_stack_fffffffffffffe7f;
    input.lower._0_7_ = in_stack_fffffffffffffe78;
    input.upper = (int64_t)in_stack_fffffffffffffe80;
    local_4 = Cast::Operation<duckdb::hugeint_t,_unsigned_int>(input);
    break;
  case ENUM:
    PVar3 = LogicalType::InternalType((LogicalType *)in_RDI.bits);
    if (PVar3 == UINT8) {
      local_4 = Cast::Operation<unsigned_char,_unsigned_int>
                          ((uchar)((ulong)in_stack_fffffffffffffe50 >> 0x38));
    }
    else if (PVar3 == UINT16) {
      local_4 = Cast::Operation<unsigned_short,_unsigned_int>
                          ((unsigned_short)((ulong)in_stack_fffffffffffffe50 >> 0x30));
    }
    else {
      if (PVar3 != UINT32) {
        local_142 = 1;
        uVar4 = __cxa_allocate_exception(0x10);
        paVar5 = &local_141;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_140,"Invalid Internal Type for ENUMs",paVar5);
        InternalException::InternalException
                  ((InternalException *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
        local_142 = 0;
        __cxa_throw(uVar4,&InternalException::typeinfo,InternalException::~InternalException);
      }
      local_4 = Cast::Operation<unsigned_int,_unsigned_int>
                          ((uint)((ulong)in_stack_fffffffffffffe50 >> 0x20));
    }
  }
  return local_4;
}

Assistant:

T Value::GetValueInternal() const {
	if (IsNull()) {
		throw InternalException("Calling GetValueInternal on a value that is NULL");
	}
	switch (type_.id()) {
	case LogicalTypeId::BOOLEAN:
		return Cast::Operation<bool, T>(value_.boolean);
	case LogicalTypeId::TINYINT:
		return Cast::Operation<int8_t, T>(value_.tinyint);
	case LogicalTypeId::SMALLINT:
		return Cast::Operation<int16_t, T>(value_.smallint);
	case LogicalTypeId::INTEGER:
		return Cast::Operation<int32_t, T>(value_.integer);
	case LogicalTypeId::BIGINT:
		return Cast::Operation<int64_t, T>(value_.bigint);
	case LogicalTypeId::HUGEINT:
	case LogicalTypeId::UUID:
		return Cast::Operation<hugeint_t, T>(value_.hugeint);
	case LogicalTypeId::UHUGEINT:
		return Cast::Operation<uhugeint_t, T>(value_.uhugeint);
	case LogicalTypeId::DATE:
		return Cast::Operation<date_t, T>(value_.date);
	case LogicalTypeId::TIME:
		return Cast::Operation<dtime_t, T>(value_.time);
	case LogicalTypeId::TIME_TZ:
		return Cast::Operation<dtime_tz_t, T>(value_.timetz);
	case LogicalTypeId::TIMESTAMP:
		return Cast::Operation<timestamp_t, T>(value_.timestamp);
	case LogicalTypeId::TIMESTAMP_SEC:
		return Cast::Operation<timestamp_sec_t, T>(value_.timestamp_s);
	case LogicalTypeId::TIMESTAMP_MS:
		return Cast::Operation<timestamp_ms_t, T>(value_.timestamp_ms);
	case LogicalTypeId::TIMESTAMP_NS:
		return Cast::Operation<timestamp_ns_t, T>(value_.timestamp_ns);
	case LogicalTypeId::TIMESTAMP_TZ:
		return Cast::Operation<timestamp_tz_t, T>(value_.timestamp_tz);
	case LogicalTypeId::UTINYINT:
		return Cast::Operation<uint8_t, T>(value_.utinyint);
	case LogicalTypeId::USMALLINT:
		return Cast::Operation<uint16_t, T>(value_.usmallint);
	case LogicalTypeId::UINTEGER:
		return Cast::Operation<uint32_t, T>(value_.uinteger);
	case LogicalTypeId::UBIGINT:
		return Cast::Operation<uint64_t, T>(value_.ubigint);
	case LogicalTypeId::FLOAT:
		return Cast::Operation<float, T>(value_.float_);
	case LogicalTypeId::DOUBLE:
		return Cast::Operation<double, T>(value_.double_);
	case LogicalTypeId::VARCHAR:
		return Cast::Operation<string_t, T>(StringValue::Get(*this).c_str());
	case LogicalTypeId::INTERVAL:
		return Cast::Operation<interval_t, T>(value_.interval);
	case LogicalTypeId::DECIMAL:
		return DefaultCastAs(LogicalType::DOUBLE).GetValueInternal<T>();
	case LogicalTypeId::ENUM: {
		switch (type_.InternalType()) {
		case PhysicalType::UINT8:
			return Cast::Operation<uint8_t, T>(value_.utinyint);
		case PhysicalType::UINT16:
			return Cast::Operation<uint16_t, T>(value_.usmallint);
		case PhysicalType::UINT32:
			return Cast::Operation<uint32_t, T>(value_.uinteger);
		default:
			throw InternalException("Invalid Internal Type for ENUMs");
		}
	}
	default:
		throw NotImplementedException("Unimplemented type \"%s\" for GetValue()", type_.ToString());
	}
}